

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.cpp
# Opt level: O2

void __thiscall
phyr::PlasticMaterial::computeScatteringFunctions
          (PlasticMaterial *this,SurfaceInteraction *si,MemoryPool *pool,TransportMode mode,
          bool allowMultipleLobes)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  double dVar4;
  bool bVar5;
  BSDF *pBVar6;
  BxDF *pBVar7;
  undefined8 *puVar8;
  _func_int **pp_Var9;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  CoefficientSpectrum<60> local_5c8;
  CoefficientSpectrum<60> local_3e8;
  CoefficientSpectrum<60> local_208;
  
  pBVar6 = (BSDF *)MemoryPool::alloc(pool,0xb0);
  BSDF::BSDF(pBVar6,si,1.0);
  si->bsdf = pBVar6;
  peVar2 = (this->Kd).
           super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Texture)(&local_5c8,peVar2,si);
  CoefficientSpectrum<60>::clamp(&local_3e8,&local_5c8,0.0,INFINITY);
  bVar5 = CoefficientSpectrum<60>::isBlack(&local_3e8);
  if (!bVar5) {
    pBVar6 = si->bsdf;
    pBVar7 = (BxDF *)MemoryPool::alloc(pool,0x1f0);
    pBVar7->type = BSDF_DIFFUSE|BSDF_REFLECTION;
    pBVar7->_vptr_BxDF = (_func_int **)&PTR__BxDF_00197d60;
    memcpy(pBVar7 + 1,&local_3e8,0x1e0);
    iVar1 = pBVar6->nBxDFs;
    pBVar6->nBxDFs = iVar1 + 1;
    pBVar6->bxdfs[iVar1] = pBVar7;
  }
  peVar2 = (this->Ks).
           super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Texture)(&local_208,peVar2,si);
  CoefficientSpectrum<60>::clamp(&local_5c8,&local_208,0.0,INFINITY);
  bVar5 = CoefficientSpectrum<60>::isBlack(&local_5c8);
  if (!bVar5) {
    puVar8 = (undefined8 *)MemoryPool::alloc(pool,0x18);
    *puVar8 = &PTR_evaluate_001985e8;
    *(undefined4 *)(puVar8 + 1) = 0;
    *(undefined4 *)((long)puVar8 + 0xc) = 0x3ff80000;
    *(undefined4 *)(puVar8 + 2) = 0;
    *(undefined4 *)((long)puVar8 + 0x14) = 0x3ff00000;
    peVar3 = (this->roughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**peVar3->_vptr_Texture)(peVar3,si);
    uVar10 = extraout_XMM0_Da;
    uVar11 = extraout_XMM0_Db;
    if (this->remapRoughness == true) {
      dVar4 = TrowbridgeReitzDistribution::roughnessToAlpha
                        ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      uVar10 = SUB84(dVar4,0);
      uVar11 = (undefined4)((ulong)dVar4 >> 0x20);
    }
    pp_Var9 = (_func_int **)MemoryPool::alloc(pool,0x20);
    *(undefined1 *)(pp_Var9 + 1) = 1;
    *pp_Var9 = (_func_int *)&PTR__MicrofacetDistribution_00198980;
    pp_Var9[2] = (_func_int *)CONCAT44(uVar11,uVar10);
    pp_Var9[3] = (_func_int *)CONCAT44(uVar11,uVar10);
    pBVar7 = (BxDF *)MemoryPool::alloc(pool,0x200);
    pBVar7->type = BSDF_GLOSSY|BSDF_REFLECTION;
    pBVar7->_vptr_BxDF = (_func_int **)&PTR__BxDF_00198808;
    memcpy(pBVar7 + 1,&local_5c8,0x1e0);
    pBVar7[0x1f]._vptr_BxDF = pp_Var9;
    *(undefined8 **)&pBVar7[0x1f].type = puVar8;
    pBVar6 = si->bsdf;
    iVar1 = pBVar6->nBxDFs;
    pBVar6->nBxDFs = iVar1 + 1;
    pBVar6->bxdfs[iVar1] = pBVar7;
  }
  return;
}

Assistant:

void PlasticMaterial::computeScatteringFunctions(SurfaceInteraction* si,
                                                 MemoryPool& pool, TransportMode mode,
                                                 bool allowMultipleLobes) const {
    si->bsdf = POOL_ALLOC(pool, BSDF)(*si);
    // Initialize diffuse component of plastic material
    Spectrum kd = Kd->evaluate(*si).clamp();
    if (!kd.isBlack())
        si->bsdf->add(POOL_ALLOC(pool, LambertianReflection)(kd));

    // Initialize specular component of plastic material
    Spectrum ks = Ks->evaluate(*si).clamp();
    if (!ks.isBlack()) {
        Fresnel* fresnel = POOL_ALLOC(pool, FresnelDielectric)(1.5f, 1.f);
        // Create microfacet distribution {distrib} for plastic material
        Real rough = roughness->evaluate(*si);
        if (remapRoughness)
            rough = TrowbridgeReitzDistribution::roughnessToAlpha(rough);
        MicrofacetDistribution *distrib =
            POOL_ALLOC(pool, TrowbridgeReitzDistribution)(rough, rough);
        BxDF* spec = POOL_ALLOC(pool, MicrofacetReflection)(ks, distrib, fresnel);
        si->bsdf->add(spec);
    }
}